

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O0

void __thiscall xray_re::xr_writer::w_sf(xr_writer *this,char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  int local_3c;
  undefined4 local_38;
  int n;
  va_list ap;
  char *format_local;
  xr_writer *this_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_f8;
  ap[0]._0_8_ = &stack0x00000008;
  n = 0x30;
  local_38 = 0x10;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  local_3c = vsnprintf(this->buf,0x2000,format,&local_38);
  if (0 < local_3c) {
    (*this->_vptr_xr_writer[2])(this,this->buf,(long)local_3c);
  }
  return;
}

Assistant:

void xr_writer::w_sf(const char* format, ...)
{
	va_list ap;
	va_start(ap, format);
#if defined(_MSC_VER) && _MSC_VER >= 1400
	int n = vsprintf_s(buf, sizeof(buf), format, ap);
#else
	int n = vsnprintf(buf, sizeof(buf), format, ap);
#endif
	va_end(ap);

	if (n > 0)
		w_raw(buf, n);
}